

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_xu_index.c
# Opt level: O3

int dwarf_get_xu_section_offset
              (Dwarf_Xu_Index_Header xuhdr,Dwarf_Unsigned irow_index,Dwarf_Unsigned column_index,
              Dwarf_Unsigned *sec_offset,Dwarf_Unsigned *sec_size,Dwarf_Error *error)

{
  Dwarf_Small *pDVar1;
  Dwarf_Unsigned DVar2;
  Dwarf_Unsigned DVar3;
  long lVar4;
  char *pcVar5;
  Dwarf_Signed errval;
  ulong v;
  long lVar6;
  Dwarf_Debug dbg;
  dwarfstring s;
  dwarfstring_s local_50;
  
  if (xuhdr == (Dwarf_Xu_Index_Header)0x0) {
    pcVar5 = "DW_DLE_XU_TYPE_ARG_ERROR: Dwarf_Xu_Index_Header pointer is null";
    errval = 0x10c;
  }
  else {
    dbg = xuhdr->gx_dbg;
    if ((dbg != (Dwarf_Debug)0x0) && (dbg->de_magic == 0xebfdebfd)) {
      if (irow_index == 0) {
        dwarfstring_constructor(&local_50);
        dwarfstring_append(&local_50,
                           "ERROR: DW_DLE_ERRONEOUS_XU_INDEX_SECTION The row index passed to dwarf_get_xu_section_offset() is zero, which is not a valid row in  the offset-table or the size table as we think of them as 1-origin."
                          );
        pcVar5 = dwarfstring_string(&local_50);
      }
      else {
        v = irow_index - 1;
        if (xuhdr->gx_units_in_index <= v) {
          dwarfstring_constructor(&local_50);
          dwarfstring_append_printf_u
                    (&local_50,"ERROR: DW_DLE_XU_NAME_COL_ERROR as the row index of %u ",v);
          dwarfstring_append_printf_u
                    (&local_50," is too high. Valid units must be < %u ",xuhdr->gx_units_in_index);
          pcVar5 = dwarfstring_string(&local_50);
          _dwarf_error_string(dbg,error,0x10e,pcVar5);
          goto LAB_00185943;
        }
        if (column_index < xuhdr->gx_column_count_sections) {
          pDVar1 = xuhdr->gx_section_data;
          DVar2 = xuhdr->gx_section_sizes_offset;
          DVar3 = xuhdr->gx_section_length;
          lVar6 = v * xuhdr->gx_column_count_sections;
          lVar4 = lVar6 * 4 + xuhdr->gx_section_offsets_offset;
          local_50.s_data = (char *)0x0;
          if (pDVar1 + column_index * 4 + lVar4 + 4 <= pDVar1 + DVar3) {
            (*dbg->de_copy_word)(&local_50,pDVar1 + column_index * 4 + lVar4,4);
            pcVar5 = local_50.s_data;
            local_50.s_data = (char *)0x0;
            if (pDVar1 + column_index * 4 + lVar6 * 4 + DVar2 + 4 <= pDVar1 + DVar3) {
              (*dbg->de_copy_word)(&local_50,pDVar1 + column_index * 4 + lVar6 * 4 + DVar2,4);
              *sec_offset = (Dwarf_Unsigned)pcVar5;
              *sec_size = (Dwarf_Unsigned)local_50.s_data;
              return 0;
            }
          }
          local_50.s_data = (char *)0x0;
          pcVar5 = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
          errval = 0x14b;
          goto LAB_0018584c;
        }
        dwarfstring_constructor(&local_50);
        dwarfstring_append_printf_u
                  (&local_50,"ERROR: DW_DLE_XU_NAME_COL_ERROR as the column index of %u ",
                   column_index);
        dwarfstring_append_printf_u
                  (&local_50," is too high. Valid column indexes  must be < %u ",
                   xuhdr->gx_column_count_sections);
        pcVar5 = dwarfstring_string(&local_50);
      }
      _dwarf_error_string(dbg,error,0x10e,pcVar5);
LAB_00185943:
      dwarfstring_destructor(&local_50);
      return 1;
    }
    pcVar5 = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_xu_section_offset()either null or it containsa stale Dwarf_Debug pointer"
    ;
    errval = 0x51;
  }
  dbg = (Dwarf_Debug)0x0;
LAB_0018584c:
  _dwarf_error_string(dbg,error,errval,pcVar5);
  return 1;
}

Assistant:

int
dwarf_get_xu_section_offset(Dwarf_Xu_Index_Header xuhdr,
    Dwarf_Unsigned  irow_index,
    Dwarf_Unsigned  column_index,
    Dwarf_Unsigned *sec_offset,
    Dwarf_Unsigned *sec_size,
    Dwarf_Error    *error)
{
    /* We use zero origin in the arrays, Users see
        one origin from the hash table. */
    Dwarf_Debug dbg = 0;
    /* get to base of tables first. */
    Dwarf_Small *offsetrow =  0;
    Dwarf_Small *sizerow =  0;
    Dwarf_Small *offsetentry = 0;
    Dwarf_Small *sizeentry =  0;
    Dwarf_Unsigned offset = 0;
    Dwarf_Unsigned size = 0;
    Dwarf_Unsigned column_count = 0;
    Dwarf_Small *section_end = 0;
    Dwarf_Unsigned row_index = irow_index-1;

    if (!xuhdr) {
        _dwarf_error_string(0,error,DW_DLE_XU_TYPE_ARG_ERROR,
            "DW_DLE_XU_TYPE_ARG_ERROR: "
            "Dwarf_Xu_Index_Header pointer is null");
        return DW_DLV_ERROR;
    }
/* FIXME */
    dbg = xuhdr->gx_dbg;
    CHECK_DBG(dbg,error,"dwarf_get_xu_section_offset()");
    sizerow =  xuhdr->gx_section_sizes_offset +
        xuhdr->gx_section_data;
    offsetrow =  xuhdr->gx_section_offsets_offset +
        xuhdr->gx_section_data;
    column_count = xuhdr->gx_column_count_sections;
    section_end = xuhdr->gx_section_data + xuhdr->gx_section_length;

    if (!irow_index) {
        dwarfstring s;

        dwarfstring_constructor(&s);
        dwarfstring_append(&s,
            "ERROR: DW_DLE_ERRONEOUS_XU_INDEX_SECTION "
            "The row index passed to dwarf_get_xu_section_offset() "
            "is zero, which is not a valid row in "
            " the offset-table or the size table as we think"
            " of them as 1-origin.");
        _dwarf_error_string(dbg, error, DW_DLE_XU_NAME_COL_ERROR,
            dwarfstring_string(&s));
        dwarfstring_destructor(&s);
        return DW_DLV_ERROR;
    }
    if (row_index >= xuhdr->gx_units_in_index) {
        dwarfstring s;

        dwarfstring_constructor(&s);
        dwarfstring_append_printf_u(&s,
            "ERROR: DW_DLE_XU_NAME_COL_ERROR as the "
            "row index of %u ",row_index);
        dwarfstring_append_printf_u(&s," is too high. "
            "Valid units must be < %u ",xuhdr->gx_units_in_index);
        _dwarf_error_string(dbg, error, DW_DLE_XU_NAME_COL_ERROR,
            dwarfstring_string(&s));
        dwarfstring_destructor(&s);
        return DW_DLV_ERROR;
    }

    if (column_index >=  xuhdr->gx_column_count_sections) {
        dwarfstring s;

        dwarfstring_constructor(&s);
        dwarfstring_append_printf_u(&s,
            "ERROR: DW_DLE_XU_NAME_COL_ERROR as the "
            "column index of %u ",column_index);
        dwarfstring_append_printf_u(&s," is too high. "
            "Valid column indexes  must be < %u ",
            xuhdr->gx_column_count_sections);
        _dwarf_error_string(dbg, error, DW_DLE_XU_NAME_COL_ERROR,
            dwarfstring_string(&s));
        dwarfstring_destructor(&s);
        return DW_DLV_ERROR;
    }
    /*  As noted above we have hidden the extra initial
        row from the offsets table so it is just
        0 to U-1. */
    offsetrow = offsetrow + (row_index*column_count * SIZEOFT32);
    offsetentry = offsetrow + (column_index *  SIZEOFT32);

    sizerow = sizerow + (row_index*column_count * SIZEOFT32);
    sizeentry = sizerow + (column_index *  SIZEOFT32);

    {
        READ_UNALIGNED_CK(dbg,offset,Dwarf_Unsigned,
            offsetentry,
            SIZEOFT32,error,section_end);
        offsetentry += SIZEOFT32;

        READ_UNALIGNED_CK(dbg,size,Dwarf_Unsigned,
            sizeentry,
            SIZEOFT32,error,section_end);
        sizeentry += SIZEOFT32;
    }
    *sec_offset = offset;
    *sec_size =  size;
    return DW_DLV_OK;
}